

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpectedFunctionsListTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_MockExpectedCallsList_callToStringForFulfilledFunctions_TestShell::createTest
          (TEST_MockExpectedCallsList_callToStringForFulfilledFunctions_TestShell *this)

{
  TEST_MockExpectedCallsList_callToStringForFulfilledFunctions_Test *this_00;
  TEST_MockExpectedCallsList_callToStringForFulfilledFunctions_TestShell *this_local;
  
  this_00 = (TEST_MockExpectedCallsList_callToStringForFulfilledFunctions_Test *)
            operator_new(0x30,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/ExpectedFunctionsListTest.cpp"
                         ,0x112);
  TEST_MockExpectedCallsList_callToStringForFulfilledFunctions_Test::
  TEST_MockExpectedCallsList_callToStringForFulfilledFunctions_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MockExpectedCallsList, callToStringForFulfilledFunctions)
{
    call1->withName("foo");
    call2->withName("bar");

    call2->callWasMade(1);
    call1->callWasMade(2);

    list->addExpectedCall(call1);
    list->addExpectedCall(call2);

    SimpleString expectedString;
    expectedString = StringFromFormat("%s\n%s", call1->callToString().asCharString(), call2->callToString().asCharString());
    STRCMP_EQUAL(expectedString.asCharString(), list->fulfilledCallsToString().asCharString());
}